

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.cpp
# Opt level: O3

void duckdb::AliasFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  long lVar2;
  BoundFunctionExpression *pBVar3;
  const_reference this;
  pointer pEVar4;
  Value v;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  Value local_50 [64];
  
  pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  lVar1 = *(long *)(*(long *)(state + 8) + 0x18);
  if (lVar1 == 0) {
    this = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)(pBVar3 + 0x180),0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this);
    (**(code **)(*(long *)pEVar4 + 0x38))(local_70,pEVar4);
  }
  else {
    local_70[0] = local_60;
    lVar2 = *(long *)(*(long *)(state + 8) + 0x10);
    std::__cxx11::string::_M_construct<char*>((string *)local_70,lVar2,lVar1 + lVar2);
  }
  duckdb::Value::Value(local_50,local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  duckdb::Vector::Reference((Value *)result);
  duckdb::Value::~Value(local_50);
  return;
}

Assistant:

static void AliasFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	Value v(state.expr.GetAlias().empty() ? func_expr.children[0]->GetName() : state.expr.GetAlias());
	result.Reference(v);
}